

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

enable_if_t<std::is_base_of<interface_type,_CustOtherImpl>::value,_interface_reference> __thiscall
poly::
vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
::emplace_back<custom::CustOtherImpl>
          (vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
           *this)

{
  bool bVar1;
  
  bVar1 = can_construct_new_elem(this,8,8);
  if (bVar1) {
    push_back_new_elem<custom::CustOtherImpl>();
  }
  else {
    push_back_new_elem_w_storage_increase<custom::CustOtherImpl>(this);
  }
  return this->_free_elem[-1].ptr.second;
}

Assistant:

inline auto vector<IF, Allocator, CloningPolicy>::emplace_back(Args&&... args)
    -> std::enable_if_t<std::is_base_of<interface_type, T>::value, interface_reference>
{
    constexpr auto s = sizeof(T);
    constexpr auto a = alignof(T);
    if (!can_construct_new_elem(s, a)) {
        push_back_new_elem_w_storage_increase(type_tag<T> {}, std::forward<Args>(args)...);
    } else {
        push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    }
    return back();
}